

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<TPZEqnArray<std::complex<double>_>,_10>::Resize
          (TPZManVector<TPZEqnArray<std::complex<double>_>,_10> *this,int64_t newsize,
          TPZEqnArray<std::complex<double>_> *object)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  ulong *puVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong *puVar7;
  ulong uVar8;
  TPZEqnArray<std::complex<double>_> *pTVar9;
  double dVar10;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar5 = (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNElements;
  if (newsize != lVar5) {
    lVar6 = (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNAlloc;
    if (lVar6 < newsize) {
      if ((ulong)newsize < 0xb) {
        if (lVar5 < 1) {
          lVar5 = 0;
        }
        else {
          lVar6 = 0;
          lVar5 = 0;
          do {
            pTVar9 = (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fStore;
            puVar1 = (undefined8 *)
                     ((long)(pTVar9->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                     lVar6 + -0x28);
            *(undefined8 *)(&this->field_0x20 + lVar6) = *puVar1;
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)(&this->field_0x28 + lVar6),
                       (TPZManVector<int,_100> *)(puVar1 + 1));
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)(&this->field_0x1d8 + lVar6),
                       (TPZManVector<int,_100> *)
                       ((long)(pTVar9->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc +
                       lVar6 + -0x20));
            TPZManVector<std::complex<double>,_1000>::operator=
                      ((TPZManVector<std::complex<double>,_1000> *)(&this->field_0x388 + lVar6),
                       (TPZManVector<std::complex<double>,_1000> *)
                       ((long)&(((TPZManVector<std::complex<double>,_1000> *)
                                ((pTVar9->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                                 fExtAlloc + -2))->super_TPZVec<std::complex<double>_>)._vptr_TPZVec
                       + lVar6));
            TPZManVector<int,_1000>::operator=
                      ((TPZManVector<int,_1000> *)(&this->field_0x4228 + lVar6),
                       (TPZManVector<int,_1000> *)
                       ((long)(pTVar9->fIndex).super_TPZManVector<int,_1000>.fExtAlloc +
                       lVar6 + -0x20));
            *(undefined4 *)(&this->field_0x51e8 + lVar6) =
                 *(undefined4 *)((long)&pTVar9->fLastTerm + lVar6);
            lVar5 = lVar5 + 1;
            lVar6 = lVar6 + 0x51d0;
          } while (lVar5 < (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNElements);
        }
        lVar6 = newsize - lVar5;
        if (lVar6 != 0 && lVar5 <= newsize) {
          lVar5 = (long)&this->super_TPZVec<TPZEqnArray<std::complex<double>_>_> + lVar5 * 0x51d0;
          do {
            *(undefined8 *)(lVar5 + 0x20) = *(undefined8 *)object;
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)(lVar5 + 0x28),
                       &(object->fEqStart).super_TPZManVector<int,_100>);
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)(lVar5 + 0x1d8),
                       &(object->fEqNumber).super_TPZManVector<int,_100>);
            TPZManVector<std::complex<double>,_1000>::operator=
                      ((TPZManVector<std::complex<double>,_1000> *)(lVar5 + 0x388),
                       &(object->fEqValues).super_TPZManVector<std::complex<double>,_1000>);
            TPZManVector<int,_1000>::operator=
                      ((TPZManVector<int,_1000> *)(lVar5 + 0x4228),
                       &(object->fIndex).super_TPZManVector<int,_1000>);
            *(int *)(lVar5 + 0x51e8) = object->fLastTerm;
            lVar5 = lVar5 + 0x51d0;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        pTVar9 = (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fStore;
        if (pTVar9 != (TPZEqnArray<std::complex<double>_> *)0x0 &&
            pTVar9 != (TPZEqnArray<std::complex<double>_> *)&this->field_0x20) {
          lVar5 = *(long *)&pTVar9[-1].fLastTerm;
          if (lVar5 != 0) {
            lVar6 = lVar5 * 0x51d0;
            do {
              TPZEqnArray<std::complex<double>_>::~TPZEqnArray
                        ((TPZEqnArray<std::complex<double>_> *)
                         ((long)pTVar9[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                         lVar6 + -0x28));
              lVar6 = lVar6 + -0x51d0;
            } while (lVar6 != 0);
          }
          operator_delete__(&pTVar9[-1].fLastTerm,lVar5 * 0x51d0 | 8);
        }
        (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fStore =
             (TPZEqnArray<std::complex<double>_> *)&this->field_0x20;
        (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNElements = newsize;
        (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNAlloc = 10;
      }
      else {
        dVar10 = (double)lVar6 * 1.2;
        uVar8 = (long)dVar10;
        if (dVar10 < (double)newsize) {
          uVar8 = newsize;
        }
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar8;
        uVar4 = 0xffffffffffffffff;
        if (SUB168(auVar2 * ZEXT816(0x51d0),8) == 0) {
          uVar4 = SUB168(auVar2 * ZEXT816(0x51d0),0) | 8;
        }
        puVar3 = (ulong *)operator_new__(uVar4);
        *puVar3 = uVar8;
        if (uVar8 != 0) {
          lVar5 = 0;
          pTVar9 = (TPZEqnArray<std::complex<double>_> *)(puVar3 + 1);
          do {
            TPZEqnArray<std::complex<double>_>::TPZEqnArray(pTVar9);
            lVar5 = lVar5 + -0x51d0;
            pTVar9 = pTVar9 + 1;
          } while (uVar8 * -0x51d0 - lVar5 != 0);
          lVar5 = (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNElements;
        }
        if (lVar5 < 1) {
          lVar5 = 0;
        }
        else {
          lVar6 = 0;
          lVar5 = 0;
          do {
            pTVar9 = (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fStore;
            puVar1 = (undefined8 *)
                     ((long)(pTVar9->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                     lVar6 + -0x28);
            *(undefined8 *)((long)puVar3 + lVar6 + 8) = *puVar1;
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)((long)puVar3 + lVar6 + 0x10),
                       (TPZManVector<int,_100> *)(puVar1 + 1));
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)((long)puVar3 + lVar6 + 0x1c0),
                       (TPZManVector<int,_100> *)
                       ((long)(pTVar9->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc +
                       lVar6 + -0x20));
            TPZManVector<std::complex<double>,_1000>::operator=
                      ((TPZManVector<std::complex<double>,_1000> *)((long)puVar3 + lVar6 + 0x370),
                       (TPZManVector<std::complex<double>,_1000> *)
                       ((long)&(((TPZManVector<std::complex<double>,_1000> *)
                                ((pTVar9->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                                 fExtAlloc + -2))->super_TPZVec<std::complex<double>_>)._vptr_TPZVec
                       + lVar6));
            TPZManVector<int,_1000>::operator=
                      ((TPZManVector<int,_1000> *)((long)puVar3 + lVar6 + 0x4210),
                       (TPZManVector<int,_1000> *)
                       ((long)(pTVar9->fIndex).super_TPZManVector<int,_1000>.fExtAlloc +
                       lVar6 + -0x20));
            *(undefined4 *)((long)puVar3 + lVar6 + 0x51d0) =
                 *(undefined4 *)((long)&pTVar9->fLastTerm + lVar6);
            lVar5 = lVar5 + 1;
            lVar6 = lVar6 + 0x51d0;
          } while (lVar5 < (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNElements);
        }
        lVar6 = newsize - lVar5;
        if (lVar6 != 0 && lVar5 <= newsize) {
          puVar7 = puVar3 + lVar5 * 0xa3a;
          do {
            puVar7[1] = *(ulong *)object;
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)(puVar7 + 2),
                       &(object->fEqStart).super_TPZManVector<int,_100>);
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)(puVar7 + 0x38),
                       &(object->fEqNumber).super_TPZManVector<int,_100>);
            TPZManVector<std::complex<double>,_1000>::operator=
                      ((TPZManVector<std::complex<double>,_1000> *)(puVar7 + 0x6e),
                       &(object->fEqValues).super_TPZManVector<std::complex<double>,_1000>);
            TPZManVector<int,_1000>::operator=
                      ((TPZManVector<int,_1000> *)(puVar7 + 0x842),
                       &(object->fIndex).super_TPZManVector<int,_1000>);
            *(int *)(puVar7 + 0xa3a) = object->fLastTerm;
            puVar7 = puVar7 + 0xa3a;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        pTVar9 = (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fStore;
        if (pTVar9 != (TPZEqnArray<std::complex<double>_> *)0x0 &&
            pTVar9 != (TPZEqnArray<std::complex<double>_> *)&this->field_0x20) {
          lVar5 = *(long *)&pTVar9[-1].fLastTerm;
          if (lVar5 != 0) {
            lVar6 = lVar5 * 0x51d0;
            do {
              TPZEqnArray<std::complex<double>_>::~TPZEqnArray
                        ((TPZEqnArray<std::complex<double>_> *)
                         ((long)pTVar9[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                         lVar6 + -0x28));
              lVar6 = lVar6 + -0x51d0;
            } while (lVar6 != 0);
          }
          operator_delete__(&pTVar9[-1].fLastTerm,lVar5 * 0x51d0 | 8);
        }
        (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fStore =
             (TPZEqnArray<std::complex<double>_> *)(puVar3 + 1);
        (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNElements = newsize;
        (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNAlloc = uVar8;
      }
    }
    else {
      lVar6 = newsize - lVar5;
      if (lVar6 != 0 && lVar5 <= newsize) {
        lVar5 = lVar5 * 0x51d0 + 0x4208;
        do {
          pTVar9 = (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fStore;
          *(undefined8 *)((long)pTVar9 + lVar5 + -0x4208) = *(undefined8 *)object;
          TPZManVector<int,_100>::operator=
                    ((TPZManVector<int,_100> *)((long)pTVar9 + lVar5 + -0x4200),
                     &(object->fEqStart).super_TPZManVector<int,_100>);
          TPZManVector<int,_100>::operator=
                    ((TPZManVector<int,_100> *)((long)pTVar9 + lVar5 + -0x4050),
                     &(object->fEqNumber).super_TPZManVector<int,_100>);
          TPZManVector<std::complex<double>,_1000>::operator=
                    ((TPZManVector<std::complex<double>,_1000> *)((long)pTVar9 + lVar5 + -0x3ea0),
                     &(object->fEqValues).super_TPZManVector<std::complex<double>,_1000>);
          TPZManVector<int,_1000>::operator=
                    ((TPZManVector<int,_1000> *)
                     ((long)(pTVar9->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                     lVar5 + -0x28),&(object->fIndex).super_TPZManVector<int,_1000>);
          *(int *)((pTVar9->fEqValues).super_TPZManVector<std::complex<double>,_1000>.fExtAlloc
                   [0xc3]._M_value + lVar5 + 8) = object->fLastTerm;
          lVar5 = lVar5 + 0x51d0;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}